

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcmain3.c
# Opt level: O0

LispPTR gcmapscan(void)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint *puStack_38;
  LispPTR content;
  LispPTR *link;
  LispPTR *prev;
  LispPTR ptr;
  LispPTR dbgcontents;
  LispPTR offset;
  LispPTR *entry;
  int probe;
  
  entry._4_4_ = 0x8000;
LAB_0013b0a1:
  do {
    entry._4_4_ = gcscan1(entry._4_4_);
    if (entry._4_4_ == -1) {
      return 0;
    }
    puVar1 = HTmain + entry._4_4_;
    while ((*puVar1 & 1) != 0) {
      link = (LispPTR *)0x0;
      uVar3 = *puVar1 & 0xfffffffe;
      while( true ) {
        puStack_38 = HTcoll + uVar3;
        if ((*puStack_38 & 0xffff0000) == 0) break;
        uVar3 = puStack_38[1];
        if (uVar3 == 0) goto LAB_0013b0a1;
        link = puStack_38;
      }
      prev._4_4_ = ((*puStack_38 & 0xfffe) >> 1) << 0x10 | entry._4_4_ << 1;
      if (link == (LispPTR *)0x0) {
        *puVar1 = puStack_38[1] | 1;
      }
      else {
        link[1] = puStack_38[1];
      }
      *puStack_38 = 0;
      puStack_38[1] = *HTcoll;
      *HTcoll = (LispPTR)((long)puStack_38 - (long)HTcoll >> 2);
      puVar2 = HTcoll + (*puVar1 & 0xfffffffe);
      if (puVar2[1] == 0) {
        *puVar1 = *puVar2;
        *puVar2 = 0;
        puVar2[1] = *HTcoll;
        *HTcoll = (LispPTR)((long)puVar2 - (long)HTcoll >> 2);
      }
      while (prev._4_4_ = gcreccell(prev._4_4_), prev._4_4_ != 0) {
        if (((*(ushort *)((ulong)(MDStypetbl + (prev._4_4_ >> 9)) ^ 2) & 0x8000) == 0) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(prev._4_4_,0);
        }
      }
      if (*puVar1 == 0) goto LAB_0013b0a1;
    }
    if ((*puVar1 & 0xffff0000) == 0) {
      prev._4_4_ = (*puVar1 >> 1 & 0x7fff) << 0x10 | entry._4_4_ << 1;
      *puVar1 = 0;
      while (prev._4_4_ = gcreccell(prev._4_4_), prev._4_4_ != 0) {
        if (((*(ushort *)((ulong)(MDStypetbl + (prev._4_4_ >> 9)) ^ 2) & 0x8000) == 0) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(prev._4_4_,0);
        }
      }
    }
  } while( true );
}

Assistant:

LispPTR gcmapscan(void) {
  int probe;
  GCENTRY *entry;
  GCENTRY offset, dbgcontents;
  LispPTR ptr;

  probe = HTMAIN_ENTRY_COUNT;
nextentry:
  while ((probe = gcscan1(probe)) != -1) {
    entry = (GCENTRY *)HTmain + probe;
  retry:
    if (HENTRY->collision) {
      GCENTRY *prev;
      GCENTRY *link;
      LispPTR content;

      prev = (GCENTRY *)0;
      link = (GCENTRY *)HTcoll + GetLinkptr((content = HTLPTR->contents));
    linkloop:
      offset = ((struct htcoll *)link)->free_ptr;
      if (StkCntIsZero(offset)) {
        /* Reclaimable object */
        ptr = VAG2(GetSegnuminColl(offset), (probe << 1));
        DelLink(link, prev, entry);
        GcreclaimLp(ptr);
        if (HTLPTR->contents == 0)
          goto nextentry;
        else
          goto retry;
      }
      if ((offset = ((struct htcoll *)link)->next_free)) {
        prev = link;
        link = (GCENTRY *)(HTcoll + offset);
        goto linkloop;
      }
      goto nextentry;
    }
    if (StkCntIsZero(dbgcontents = HTLPTR->contents)) {
      ptr = VAG2(HENTRY->segnum, (probe << 1));
      HTLPTR->contents = 0;
      GcreclaimLp(ptr);
    }
  }
  return (NIL);
}